

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxcbconnection_screens.cpp
# Opt level: O2

void __thiscall QXcbConnection::destroyScreen(QXcbConnection *this,QXcbScreen *screen)

{
  QXcbVirtualDesktop *this_00;
  Data *pDVar1;
  QPlatformScreen **ppQVar2;
  long lVar3;
  QPlatformScreen *pQVar4;
  QXcbScreen *this_01;
  QLoggingCategory *pQVar5;
  QDebug *pQVar6;
  qsizetype qVar7;
  QXcbConnection *c;
  long in_FS_OFFSET;
  QXcbScreen *newPrimary;
  Stream *local_90;
  undefined1 local_88 [8];
  QArrayDataPointer<QPlatformScreen_*> local_80;
  xcb_randr_monitor_info_t *local_68;
  QDebug local_60;
  Stream *local_58;
  undefined1 local_50 [8];
  QArrayDataPointer<char16_t> local_48;
  QXcbScreen *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = screen->m_virtualDesktop;
  pDVar1 = (this_00->m_screens).d.d;
  local_80.d._0_4_ = SUB84(pDVar1,0);
  local_80.d._4_4_ = (undefined4)((ulong)pDVar1 >> 0x20);
  ppQVar2 = (this_00->m_screens).d.ptr;
  local_80.ptr._0_4_ = SUB84(ppQVar2,0);
  local_80.ptr._4_4_ = (undefined4)((ulong)ppQVar2 >> 0x20);
  lVar3 = (this_00->m_screens).d.size;
  local_80.size._0_4_ = (undefined4)lVar3;
  local_80.size._4_4_ = (undefined4)((ulong)lVar3 >> 0x20);
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_30 = screen;
  QArrayDataPointer<QPlatformScreen_*>::~QArrayDataPointer(&local_80);
  this_01 = local_30;
  if (lVar3 == 1) {
    local_48.size = -0x5555555555555556;
    local_48.d._0_4_ = 0xaaaaaaaa;
    local_48.d._4_4_ = 0xaaaaaaaa;
    local_48.ptr._0_1_ = (QXcbScreen)0xaa;
    local_48.ptr._1_3_ = 0xaaaaaa;
    local_48.ptr._4_4_ = 0xaaaaaaaa;
    (**(code **)(*(long *)local_30 + 0x90))();
    QXcbScreen::setOutput((QXcbScreen *)this_01,0,(xcb_randr_get_output_info_reply_t *)0x0);
    pQVar5 = QtPrivateLogging::lcQpaScreen();
    if (((pQVar5->field_2).bools.enabledDebug._q_value._M_base._M_i & 1U) != 0) {
      local_68 = (xcb_randr_monitor_info_t *)pQVar5->name;
      local_80.d._0_4_ = 2;
      local_80.d._4_4_ = 0;
      local_80.ptr._0_1_ = (QXcbScreen)0x0;
      local_80.ptr._1_3_ = 0;
      local_80.ptr._4_4_ = 0;
      local_80.size._0_4_ = 0;
      local_80.size._4_4_ = 0;
      QMessageLogger::debug();
      pQVar6 = QDebug::operator<<(&local_60,"transformed");
      pQVar6 = QDebug::operator<<(pQVar6,(QString *)&local_48);
      pQVar6 = QDebug::operator<<(pQVar6,"to fake");
      local_58 = pQVar6->stream;
      *(int *)(local_58 + 0x28) = *(int *)(local_58 + 0x28) + 1;
      ::operator<<((Stream *)local_50,(QXcbScreen *)&local_58);
      QDebug::~QDebug((QDebug *)local_50);
      QDebug::~QDebug((QDebug *)&local_58);
      QDebug::~QDebug(&local_60);
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  }
  else {
    c = this + 0x338;
    QtPrivate::sequential_erase_one<QList<QXcbScreen*>,QXcbScreen*>
              ((QList<QXcbScreen_*> *)c,&local_30);
    QXcbVirtualDesktop::removeScreen(this_00,&local_30->super_QPlatformScreen);
    if (local_30->m_primary == true) {
      pDVar1 = (this_00->m_screens).d.d;
      local_80.d._0_4_ = SUB84(pDVar1,0);
      local_80.d._4_4_ = (undefined4)((ulong)pDVar1 >> 0x20);
      ppQVar2 = (this_00->m_screens).d.ptr;
      local_80.ptr._0_4_ = SUB84(ppQVar2,0);
      local_80.ptr._4_4_ = (undefined4)((ulong)ppQVar2 >> 0x20);
      qVar7 = (this_00->m_screens).d.size;
      local_80.size._0_4_ = (undefined4)qVar7;
      local_80.size._4_4_ = (undefined4)((ulong)qVar7 >> 0x20);
      if (pDVar1 != (Data *)0x0) {
        LOCK();
        (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pQVar4 = *ppQVar2;
      QArrayDataPointer<QPlatformScreen_*>::~QArrayDataPointer(&local_80);
      local_80.d._0_4_ = SUB84(pQVar4,0);
      local_80.d._4_4_ = (undefined4)((ulong)pQVar4 >> 0x20);
      pQVar4[0x3c] = (QPlatformScreen)0x1;
      qVar7 = QtPrivate::indexOf<QXcbScreen*,QXcbScreen*>
                        ((QList<QXcbScreen_*> *)c,(QXcbScreen **)&local_80,0);
      if (0 < (int)(uint)qVar7) {
        QList<QXcbScreen_*>::swapItemsAt
                  ((QList<QXcbScreen_*> *)c,0,(ulong)((uint)qVar7 & 0x7fffffff));
      }
      QWindowSystemInterface::handlePrimaryScreenChanged
                ((QPlatformScreen *)CONCAT44(local_80.d._4_4_,local_80.d._0_4_));
    }
    pQVar5 = QtPrivateLogging::lcQpaScreen();
    if (((pQVar5->field_2).bools.enabledDebug._q_value._M_base._M_i & 1U) != 0) {
      local_68 = (xcb_randr_monitor_info_t *)pQVar5->name;
      local_80.d._0_4_ = 2;
      local_80.d._4_4_ = 0;
      local_80.ptr._0_1_ = (QXcbScreen)0x0;
      local_80.ptr._1_3_ = 0;
      local_80.ptr._4_4_ = 0;
      local_80.size._0_4_ = 0;
      local_80.size._4_4_ = 0;
      QMessageLogger::debug();
      pQVar6 = QDebug::operator<<((QDebug *)&local_48,"destroyScreen: destroy");
      local_90 = pQVar6->stream;
      *(int *)(local_90 + 0x28) = *(int *)(local_90 + 0x28) + 1;
      ::operator<<((Stream *)local_88,(QXcbScreen *)&local_90);
      QDebug::~QDebug((QDebug *)local_88);
      QDebug::~QDebug((QDebug *)&local_90);
      QDebug::~QDebug((QDebug *)&local_48);
    }
    QWindowSystemInterface::handleScreenRemoved(&local_30->super_QPlatformScreen);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QXcbConnection::destroyScreen(QXcbScreen *screen)
{
    QXcbVirtualDesktop *virtualDesktop = screen->virtualDesktop();
    if (virtualDesktop->screens().size() == 1) {
        // If there are no other screens on the same virtual desktop,
        // then transform the physical screen into a fake screen.
        const QString nameWas = screen->name();
        screen->setOutput(XCB_NONE, nullptr);
        qCDebug(lcQpaScreen) << "transformed" << nameWas << "to fake" << screen;
    } else {
        // There is more than one screen on the same virtual desktop, remove the screen
        m_screens.removeOne(screen);
        virtualDesktop->removeScreen(screen);

        // When primary screen is removed, set the new primary screen
        // which belongs to the primary virtual desktop.
        if (screen->isPrimary()) {
            QXcbScreen *newPrimary = static_cast<QXcbScreen *>(virtualDesktop->screens().at(0));
            newPrimary->setPrimary(true);
            const int idx = m_screens.indexOf(newPrimary);
            if (idx > 0)
                m_screens.swapItemsAt(0, idx);
            QWindowSystemInterface::handlePrimaryScreenChanged(newPrimary);
        }

        qCDebug(lcQpaScreen) << "destroyScreen: destroy" << screen;
        QWindowSystemInterface::handleScreenRemoved(screen);
    }
}